

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O0

void TestStringToFloatVarious(void)

{
  char *value_source;
  double expected;
  char *expected_source;
  double dVar1;
  char *file;
  bool all_used;
  int processed;
  int flags;
  bool *in_stack_00000190;
  int *in_stack_00000198;
  double in_stack_000001a0;
  int in_stack_000001ac;
  char *in_stack_000001b0;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff30;
  double in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  int iVar2;
  char *in_stack_ffffffffffffff50;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar2,in_stack_ffffffffffffff40,
                    in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
              in_stack_ffffffffffffff30,SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar2,in_stack_ffffffffffffff40,
                    in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
              in_stack_ffffffffffffff30,SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar2,in_stack_ffffffffffffff40,
                    in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
              in_stack_ffffffffffffff30,SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar2,in_stack_ffffffffffffff40,
                    in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
              in_stack_ffffffffffffff30,SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar2,in_stack_ffffffffffffff40,
                    in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
              in_stack_ffffffffffffff30,SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar2,in_stack_ffffffffffffff40,
                    in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
              in_stack_ffffffffffffff30,SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar2,in_stack_ffffffffffffff40,
                    in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
              in_stack_ffffffffffffff30,SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  value_source = (char *)double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar2,in_stack_ffffffffffffff40,
                    in_stack_ffffffffffffff38,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar2,in_stack_ffffffffffffff40,
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  expected = double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar2,in_stack_ffffffffffffff40,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar2,in_stack_ffffffffffffff40,
                    (int)((ulong)expected >> 0x20),value_source,in_stack_ffffffffffffff2c);
  expected_source = (char *)double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar2,expected_source,(int)((ulong)expected >> 0x20),
                    value_source,in_stack_ffffffffffffff2c);
  dVar1 = double_conversion::Double::NaN();
  iVar2 = (int)((ulong)dVar1 >> 0x20);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(in_stack_ffffffffffffff50,iVar2,expected_source,(int)((ulong)expected >> 0x20),
                    value_source,in_stack_ffffffffffffff2c);
  file = (char *)double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckHelper(expected_source,(int)((ulong)expected >> 0x20),value_source,
              SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
  double_conversion::Double::NaN();
  StrToF(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  CheckEqualsHelper(file,iVar2,expected_source,expected,value_source,
                    (double)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  CheckEqualsHelper(file,iVar2,expected_source,(int)((ulong)expected >> 0x20),value_source,
                    in_stack_ffffffffffffff2c);
  return;
}

Assistant:

TEST(StringToFloatVarious) {
  int flags;
  int processed;
  bool all_used;

  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(0.0f, StrToF("", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0f, StrToF("  ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("  ", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF("42", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF(" + 42 ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-42.0f, StrToF(" - 42 ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF("x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("42x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" + 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" - 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(0.0f, StrToF("", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0f, StrToF("  ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("  ", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF("42", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF(" + 42 ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-42.0f, StrToF(" - 42 ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF("x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(42.0f, StrToF("42x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(42.0f, StrToF("42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(42.0f, StrToF(" + 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(6, processed);

  CHECK_EQ(-42.0f, StrToF(" - 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(6, processed);


  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(0.0f, StrToF("", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0f, StrToF("  ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("  ", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF("42", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF(" + 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(5, processed);

  CHECK_EQ(-42.0f, StrToF(" - 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(5, processed);

  CHECK_EQ(Double::NaN(), StrToF("x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(42.0f, StrToF("42x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(42.0f, StrToF("42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(42.0f, StrToF(" + 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(5, processed);

  CHECK_EQ(-42.0f, StrToF(" - 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(5, processed);

  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(42.0f, StrToF(" +42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(4, processed);

  CHECK_EQ(-42.0f, StrToF(" -42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(4, processed);

  CHECK_EQ(Double::NaN(), StrToF(" + 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" - 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::NO_FLAGS;

  CHECK_EQ(0.0f, StrToF("", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF("  ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("  ", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(42.0f, StrToF("42", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF(" + 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" - 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("42x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" + 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" - 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES;

  CHECK_EQ(0.0f, StrToF(" ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF(" ", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF(" 42", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF("42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(0.0f, StrToF(" ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF(" ", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF("42 ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF(" 42", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);
}